

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# L2NormCost.cpp
# Opt level: O2

bool __thiscall
iDynTree::optimalcontrol::L2NormCost::setStateDesiredPoint
          (L2NormCost *this,VectorDynSize *desiredPoint)

{
  L2NormCostImplementation *pLVar1;
  uint uVar2;
  ulong uVar3;
  char *pcVar4;
  shared_ptr<iDynTree::optimalcontrol::TimeInvariantObject<iDynTree::VectorDynSize>_> newTrajectory;
  __shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::VectorDynSize>,_(__gnu_cxx::_Lock_policy)2>
  _Stack_38;
  __shared_ptr<iDynTree::optimalcontrol::TimeInvariantObject<iDynTree::VectorDynSize>,_(__gnu_cxx::_Lock_policy)2>
  local_28;
  
  if ((this->m_pimpl->stateCost).m_valid == false) {
    pcVar4 = "The state cost portion has been deactivated, given the provided selectors.";
  }
  else {
    uVar3 = iDynTree::VectorDynSize::size();
    uVar2 = iDynTree::VectorDynSize::size();
    if (uVar3 == uVar2) {
      std::
      make_shared<iDynTree::optimalcontrol::TimeInvariantObject<iDynTree::VectorDynSize>,iDynTree::VectorDynSize_const&>
                ((VectorDynSize *)&local_28);
      pLVar1 = this->m_pimpl;
      std::
      __shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::VectorDynSize>,(__gnu_cxx::_Lock_policy)2>
      ::__shared_ptr<iDynTree::optimalcontrol::TimeInvariantObject<iDynTree::VectorDynSize>,void>
                ((__shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::VectorDynSize>,(__gnu_cxx::_Lock_policy)2>
                  *)&_Stack_38,&local_28);
      std::
      __shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::VectorDynSize>,_(__gnu_cxx::_Lock_policy)2>
      ::operator=(&(pLVar1->stateCost).desiredTrajectory.
                   super___shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::VectorDynSize>,_(__gnu_cxx::_Lock_policy)2>
                  ,&_Stack_38);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_38._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28._M_refcount);
      return true;
    }
    pcVar4 = "The desiredPoint size do not match the dimension of the specified selector.";
  }
  iDynTree::reportError("L2NormCost","setStateDesiredPoint",pcVar4);
  return false;
}

Assistant:

bool L2NormCost::setStateDesiredPoint(const VectorDynSize &desiredPoint)
        {
            if (!(m_pimpl->stateCost.isValid())) {
                reportError("L2NormCost", "setStateDesiredPoint", "The state cost portion has been deactivated, given the provided selectors.");
                return false;
            }

            if (desiredPoint.size() != (m_pimpl->stateCost.selector->size())) {
                reportError("L2NormCost", "setStateDesiredPoint", "The desiredPoint size do not match the dimension of the specified selector.");
                return false;
            }

            std::shared_ptr<TimeInvariantVector> newTrajectory = std::make_shared<TimeInvariantVector>(desiredPoint);
            return m_pimpl->stateCost.setDesiredTrajectory(newTrajectory);
        }